

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O0

int methodIndexToSignalIndex(QMetaObject **base,int signal_index)

{
  long lVar1;
  int iVar2;
  int iVar3;
  QMetaObject *metaobject;
  int in_ESI;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  QMetaObject *metaObject;
  int methodOffset;
  int signalOffset;
  QMetaObject *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffcc;
  int local_24;
  int local_14;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_14 = in_ESI;
  if (-1 < in_ESI) {
    metaobject = (QMetaObject *)*in_RDI;
    while( true ) {
      in_stack_ffffffffffffffcc = in_stack_ffffffffffffffcc & 0xffffff;
      if (metaobject != (QMetaObject *)0x0) {
        iVar2 = QMetaObject::methodOffset
                          ((QMetaObject *)
                           CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
        in_stack_ffffffffffffffcc = CONCAT13(in_ESI < iVar2,(int3)in_stack_ffffffffffffffcc);
      }
      if ((char)(in_stack_ffffffffffffffcc >> 0x18) == '\0') break;
      metaobject = QMetaObject::superClass((QMetaObject *)0x3f54b3);
    }
    local_24 = in_ESI;
    if (metaobject != (QMetaObject *)0x0) {
      computeOffsets(metaobject,(int *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8)
                     ,(int *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
      iVar2 = in_ESI;
      iVar3 = QMetaObject::methodCount(metaobject);
      if (iVar2 < iVar3) {
        local_24 = QMetaObjectPrivate::originalClone(in_stack_ffffffffffffffb8,0);
        local_24 = local_24 + -0x55555556;
      }
      *in_RDI = metaobject;
    }
    local_14 = local_24;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_14;
}

Assistant:

static int methodIndexToSignalIndex(const QMetaObject **base, int signal_index)
{
    if (signal_index < 0)
        return signal_index;
    const QMetaObject *metaObject = *base;
    while (metaObject && metaObject->methodOffset() > signal_index)
        metaObject = metaObject->superClass();

    if (metaObject) {
        int signalOffset, methodOffset;
        computeOffsets(metaObject, &signalOffset, &methodOffset);
        if (signal_index < metaObject->methodCount())
            signal_index = QMetaObjectPrivate::originalClone(metaObject, signal_index - methodOffset) + signalOffset;
        else
            signal_index = signal_index - methodOffset + signalOffset;
        *base = metaObject;
    }
    return signal_index;
}